

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.cpp
# Opt level: O0

void __thiscall
mjs::function_object::put_function
          (function_object *this,gc_heap_ptr<mjs::gc_function> *f,gc_heap_ptr<mjs::gc_string> *name,
          gc_heap_ptr<mjs::gc_string> *body_text,int named_args)

{
  bool bVar1;
  byte local_39;
  gc_heap_ptr_untracked<mjs::gc_string,_true> local_38;
  gc_heap_ptr_untracked<mjs::gc_string,_true> local_34;
  gc_heap_ptr_untracked<mjs::gc_function,_true> local_30;
  int local_2c;
  gc_heap_ptr_untyped *pgStack_28;
  int named_args_local;
  gc_heap_ptr<mjs::gc_string> *body_text_local;
  gc_heap_ptr<mjs::gc_string> *name_local;
  gc_heap_ptr<mjs::gc_function> *f_local;
  function_object *this_local;
  
  local_2c = named_args;
  pgStack_28 = &body_text->super_gc_heap_ptr_untyped;
  body_text_local = name;
  name_local = (gc_heap_ptr<mjs::gc_string> *)f;
  f_local = (gc_heap_ptr<mjs::gc_function> *)this;
  bVar1 = mjs::gc_heap_ptr_untracked::operator_cast_to_bool((gc_heap_ptr_untracked *)&this->call_);
  local_39 = 0;
  if (!bVar1) {
    bVar1 = mjs::gc_heap_ptr_untracked::operator_cast_to_bool((gc_heap_ptr_untracked *)&this->text_)
    ;
    local_39 = 0;
    if ((!bVar1) && (local_39 = 0, this->named_args_ == 0)) {
      local_39 = this->is_native_ ^ 0xff;
    }
  }
  if ((local_39 & 1) == 0) {
    __assert_fail("!call_ && !text_ && !named_args_ && !is_native_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.cpp"
                  ,0x7b,
                  "void mjs::function_object::put_function(const gc_heap_ptr<gc_function> &, const gc_heap_ptr<gc_string> &, const gc_heap_ptr<gc_string> &, int)"
                 );
  }
  gc_heap_ptr_untracked<mjs::gc_function,_true>::gc_heap_ptr_untracked
            (&local_30,(gc_heap_ptr<mjs::gc_function> *)name_local);
  (this->call_).pos_ = local_30.pos_;
  bVar1 = gc_heap_ptr_untyped::operator_cast_to_bool(pgStack_28);
  if (bVar1) {
    bVar1 = gc_heap_ptr_untyped::operator_cast_to_bool(&body_text_local->super_gc_heap_ptr_untyped);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!name",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.cpp"
                    ,0x81,
                    "void mjs::function_object::put_function(const gc_heap_ptr<gc_function> &, const gc_heap_ptr<gc_string> &, const gc_heap_ptr<gc_string> &, int)"
                   );
    }
    gc_heap_ptr_untracked<mjs::gc_string,_true>::gc_heap_ptr_untracked
              (&local_38,(gc_heap_ptr<mjs::gc_string> *)pgStack_28);
    (this->text_).pos_ = local_38.pos_;
  }
  else {
    gc_heap_ptr_untracked<mjs::gc_string,_true>::gc_heap_ptr_untracked(&local_34,body_text_local);
    (this->text_).pos_ = local_34.pos_;
    this->is_native_ = true;
  }
  this->named_args_ = local_2c;
  return;
}

Assistant:

void function_object::put_function(const gc_heap_ptr<gc_function>& f, const gc_heap_ptr<gc_string>& name, const gc_heap_ptr<gc_string>& body_text, int named_args) {
    assert(!call_ && !text_ && !named_args_ && !is_native_);
    call_ = f;
    if (!body_text) {
        text_ = name;
        is_native_ = true;
    } else {
        assert(!name);
        text_ = body_text;
    }
    named_args_ = named_args;
}